

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManFirstFanouts(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  ulong uVar2;
  int v;
  long lVar3;
  
  p_00 = Vec_IntStart(p->nObjs);
  lVar3 = 0;
  do {
    if (p->nObjs <= lVar3) {
      return p_00;
    }
    v = (int)lVar3;
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      return p_00;
    }
    iVar1 = (int)*(ulong *)pObj;
    uVar2 = *(ulong *)pObj & 0x1fffffff;
    if (uVar2 == 0x1fffffff || iVar1 < 0) {
      if (iVar1 < 0 && (int)uVar2 != 0x1fffffff) {
        iVar1 = Gia_ObjFaninId0p(p,pObj);
        iVar1 = Vec_IntEntry(p_00,iVar1);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFaninId0p(p,pObj);
          goto LAB_0021800b;
        }
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0p(p,pObj);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId0p(p,pObj);
        Vec_IntWriteEntry(p_00,iVar1,v);
      }
      iVar1 = Gia_ObjFaninId1p(p,pObj);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId1p(p,pObj);
        Vec_IntWriteEntry(p_00,iVar1,v);
      }
      if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar3] != 0)) {
        iVar1 = Gia_ObjFaninId2p(p,pObj);
        iVar1 = Vec_IntEntry(p_00,iVar1);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFaninId2p(p,pObj);
LAB_0021800b:
          Vec_IntWriteEntry(p_00,iVar1,v);
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManFirstFanouts( Gia_Man_t * p )
{
    Vec_Int_t * vFans = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId1p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId1p(p, pObj), i);
            if ( Gia_ObjIsMuxId(p, i) && Vec_IntEntry(vFans, Gia_ObjFaninId2p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId2p(p, pObj), i);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
        }
    }
    return vFans;
}